

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O1

void __thiscall QWidgetResizeHandler::doResize(QWidgetResizeHandler *this)

{
  QWidget *pQVar1;
  long lVar2;
  QPoint QVar3;
  undefined4 extraout_EDX;
  uint uVar4;
  MousePosition m;
  long in_FS_OFFSET;
  int iVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 2);
    pQVar1 = *(QWidget **)(this + 0x10);
    local_28 = (QPoint)QCursor::pos();
    QVar3 = QWidget::mapFromGlobal(pQVar1,&local_28);
    *(QPoint *)(this + 0x20) = QVar3;
    lVar2 = *(long *)(*(long *)(this + 0x10) + 0x20);
    iVar5 = (int)*(undefined8 *)(this + 0x20);
    iVar7 = -(uint)(iVar5 < (((int)*(undefined8 *)(lVar2 + 0x1c) -
                             (int)*(undefined8 *)(lVar2 + 0x14)) + 1) / 2);
    iVar8 = -(uint)((int)((ulong)*(undefined8 *)(this + 0x20) >> 0x20) <
                   (((int)((ulong)*(undefined8 *)(lVar2 + 0x1c) >> 0x20) -
                    (int)((ulong)*(undefined8 *)(lVar2 + 0x14) >> 0x20)) + 1) / 2);
    auVar6._4_4_ = iVar7;
    auVar6._0_4_ = iVar7;
    auVar6._8_4_ = iVar8;
    auVar6._12_4_ = iVar8;
    uVar4 = movmskpd(extraout_EDX,auVar6);
    m = (uVar4 & 0xfffffffe) + BottomRight;
    if ((uVar4 & 1) != 0) {
      m = (uint)((uVar4 & 2) == 0) * 2 + TopLeft;
    }
    *(MousePosition *)(this + 0x30) = m;
    *(ulong *)(this + 0x28) =
         CONCAT44(*(int *)(lVar2 + 0x20) - (*(int *)(lVar2 + 0x18) + *(int *)(this + 0x24)),
                  *(int *)(lVar2 + 0x1c) - (iVar5 + *(int *)(lVar2 + 0x14)));
    setMouseCursor(this,m);
    pQVar1 = *(QWidget **)(this + 0x10);
    QWidget::cursor((QWidget *)&local_28);
    QWidget::grabMouse(pQVar1,(QCursor *)&local_28);
    QCursor::~QCursor((QCursor *)&local_28);
    QWidget::grabKeyboard(*(QWidget **)(this + 0x10));
    resizeHorizontalDirectionFixed = 0;
    resizeVerticalDirectionFixed = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetResizeHandler::doResize()
{
    if (!enabled)
        return;

    active = true;
    moveOffset = widget->mapFromGlobal(QCursor::pos());
    if (moveOffset.x() < widget->width()/2) {
        if (moveOffset.y() < widget->height()/2)
            mode = TopLeft;
        else
            mode = BottomLeft;
    } else {
        if (moveOffset.y() < widget->height()/2)
            mode = TopRight;
        else
            mode = BottomRight;
    }
    invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
#ifndef QT_NO_CURSOR
    setMouseCursor(mode);
    widget->grabMouse(widget->cursor() );
#else
    widget->grabMouse();
#endif
    widget->grabKeyboard();
    resizeHorizontalDirectionFixed = false;
    resizeVerticalDirectionFixed = false;
}